

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitVariableAndOrFunctionDeclaration
          (SyntaxDumper *this,VariableAndOrFunctionDeclarationSyntax *node)

{
  VariableAndOrFunctionDeclarationSyntax local_a8 [72];
  SyntaxToken local_60 [56];
  DeclaratorListSyntax *local_28;
  DeclaratorListSyntax *iter_1;
  SpecifierListSyntax *iter;
  VariableAndOrFunctionDeclarationSyntax *node_local;
  SyntaxDumper *this_local;
  
  iter = (SpecifierListSyntax *)node;
  node_local = (VariableAndOrFunctionDeclarationSyntax *)this;
  traverseDeclaration(this,(DeclarationSyntax *)node);
  for (iter_1 = (DeclaratorListSyntax *)
                VariableAndOrFunctionDeclarationSyntax::specifiers
                          ((VariableAndOrFunctionDeclarationSyntax *)iter);
      iter_1 != (DeclaratorListSyntax *)0x0; iter_1 = *(DeclaratorListSyntax **)(iter_1 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(iter_1 + 8));
  }
  for (local_28 = VariableAndOrFunctionDeclarationSyntax::declarators
                            ((VariableAndOrFunctionDeclarationSyntax *)iter);
      local_28 != (DeclaratorListSyntax *)0x0;
      local_28 = *(DeclaratorListSyntax **)(local_28 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_28 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_60,iter);
    psy::C::SyntaxToken::~SyntaxToken(local_60);
  }
  VariableAndOrFunctionDeclarationSyntax::semicolonToken(local_a8);
  (**(code **)(*(long *)this + 0x2e8))(this,local_a8,iter);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_a8);
  return Skip;
}

Assistant:

virtual Action visitVariableAndOrFunctionDeclaration(const VariableAndOrFunctionDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }